

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalSubtyping.cpp
# Opt level: O3

void __thiscall
wasm::LocalSubtyping::doWalkFunction(wasm::Function*)::Scanner::visitLocalSet(wasm::LocalSet__
          (void *this,LocalSet *curr)

{
  vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>> *this_00;
  uint uVar1;
  iterator __position;
  LocalSet *local_10;
  LocalSet *curr_local;
  
  uVar1 = curr->index;
  if ((*(ulong *)(*(long *)((long)this + 0xd8) + (ulong)(uVar1 >> 6) * 8) >> ((ulong)uVar1 & 0x3f) &
      1) != 0) {
    this_00 = (vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>> *)
              (*(long *)((long)this + 0x100) + (ulong)uVar1 * 0x18);
    __position._M_current = *(LocalSet ***)(this_00 + 8);
    if (__position._M_current == *(LocalSet ***)(this_00 + 0x10)) {
      local_10 = curr;
      std::vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>>::
      _M_realloc_insert<wasm::LocalSet*const&>(this_00,__position,&local_10);
    }
    else {
      *__position._M_current = curr;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
    }
  }
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
        if (relevant[curr->index]) {
          setsForLocal[curr->index].push_back(curr);
        }
      }